

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

idx_t __thiscall
duckdb::AsOfLocalSourceState::BeginRightScan(AsOfLocalSourceState *this,idx_t hash_bin_p)

{
  HashGroupPtr *this_00;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> __ptr;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> __ptr_00;
  reference pvVar2;
  pointer pPVar3;
  pointer pGVar4;
  type global_sort_state;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> this_01;
  reference pvVar5;
  pointer pPVar6;
  pointer pRVar7;
  idx_t iVar8;
  
  this->hash_bin = hash_bin_p;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::operator[](&(this->gsource->gsink->rhs_sink).hash_groups,hash_bin_p);
  this_00 = &this->hash_group;
  _Var1._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
  (pvVar2->
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
       (PartitionGlobalHashGroup *)0x0;
  __ptr._M_head_impl =
       (this->hash_group).
       super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
  (this->hash_group).
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  if (__ptr._M_head_impl != (PartitionGlobalHashGroup *)0x0) {
    ::std::default_delete<duckdb::PartitionGlobalHashGroup>::operator()
              ((default_delete<duckdb::PartitionGlobalHashGroup> *)this_00,__ptr._M_head_impl);
  }
  pPVar3 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
           ::operator->(this_00);
  pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&pPVar3->global_sort);
  if ((pGVar4->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pGVar4->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar8 = 0;
  }
  else {
    pPVar3 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
             ::operator->(this_00);
    global_sort_state =
         unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
         operator*(&pPVar3->global_sort);
    this_01._M_head_impl = (PayloadScanner *)operator_new(0x18);
    PayloadScanner::PayloadScanner(this_01._M_head_impl,global_sort_state,true);
    __ptr_00._M_head_impl =
         (this->scanner).
         super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
         .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl;
    (this->scanner).
    super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
    super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
    super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = this_01._M_head_impl;
    if (__ptr_00._M_head_impl != (PayloadScanner *)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()
                ((default_delete<duckdb::PayloadScanner> *)&this->scanner,__ptr_00._M_head_impl);
    }
    pvVar5 = vector<duckdb::OuterJoinMarker,_true>::operator[]
                       (&this->gsource->gsink->right_outers,this->hash_bin);
    this->found_match =
         (pvVar5->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    pPVar6 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->scanner);
    pRVar7 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(&pPVar6->scanner);
    iVar8 = pRVar7->total_count - pRVar7->total_scanned;
  }
  return iVar8;
}

Assistant:

idx_t AsOfLocalSourceState::BeginRightScan(const idx_t hash_bin_p) {
	hash_bin = hash_bin_p;

	hash_group = std::move(gsource.gsink.rhs_sink.hash_groups[hash_bin]);
	if (hash_group->global_sort->sorted_blocks.empty()) {
		return 0;
	}
	scanner = make_uniq<PayloadScanner>(*hash_group->global_sort);
	found_match = gsource.gsink.right_outers[hash_bin].GetMatches();

	return scanner->Remaining();
}